

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O1

void __thiscall
calc4::anon_unknown_0::Visitor<__int128>::Visit
          (Visitor<__int128> *this,shared_ptr<const_calc4::UserDefinedOperator> *op)

{
  _Optional_payload_base<bool> _Var1;
  element_type *peVar2;
  _func_int *p_Var3;
  OperatorDefinition *other;
  undefined8 uVar4;
  char *pcVar5;
  size_type sVar6;
  long lVar7;
  long lVar8;
  __shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2> *p_Var9;
  bool bVar10;
  int iVar11;
  ostream *poVar12;
  long lVar13;
  ulong uVar14;
  undefined8 uStack_60;
  int aiStack_58 [2];
  undefined1 local_50 [8];
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  operands;
  
  peVar2 = (op->super___shared_ptr<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  lVar7 = -((long)(peVar2->definition).numOperands * 4 + 0xfU & 0xfffffffffffffff0);
  lVar8 = lVar7 + -0x58;
  p_Var3 = (peVar2->super_Operator)._vptr_Operator[1];
  *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bda4;
  (*p_Var3)(local_50);
  if ((undefined1  [8])
      operands.
      super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
      ._M_impl.super__Vector_impl_data._M_start != local_50) {
    lVar13 = 0;
    uVar14 = 0;
    do {
      p_Var9 = (__shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2> *)local_50;
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bdc0;
      iVar11 = ProcessOperator(this,(shared_ptr<const_calc4::Operator> *)
                                    ((long)&p_Var9->_M_ptr + lVar13));
      *(int *)((long)aiStack_58 + uVar14 * 4 + lVar8 + 0x58) = iVar11;
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + 0x10;
    } while (uVar14 < (ulong)((long)operands.
                                    super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start - (long)local_50 >> 4)
            );
  }
  peVar2 = (op->super___shared_ptr<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  _Var1 = (peVar2->isTailCall).super__Optional_base<bool,_true,_true>._M_payload.
          super__Optional_payload_base<bool>;
  if (((ushort)_Var1 >> 8 & 1 & (ushort)_Var1) != 0) {
    other = this->definition;
    *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11be04;
    bVar10 = OperatorDefinition::operator==(&peVar2->definition,other);
    if (bVar10) {
      if (0 < (int)((ulong)((long)operands.
                                  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start - (long)local_50) >> 4))
      {
        lVar13 = 0;
        do {
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11be2b;
          poVar12 = Append(this);
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11be42;
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"arg_",4);
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11be4d;
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,(int)lVar13);
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11be64;
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," = ",3);
          iVar11 = *(int *)((long)aiStack_58 + lVar13 * 4 + lVar8 + 0x58);
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11be7c;
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"var_",4);
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11be87;
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar11);
          operands.
          super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0x3b;
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11be9c;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(char *)((long)&operands.
                                                  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               + 4),1);
          uVar4 = *(undefined8 *)(*(long *)poVar12 + -0x18);
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11beb3;
          std::ios::widen((char)uVar4 + (char)poVar12);
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bebe;
          std::ostream::put((char)poVar12);
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bec6;
          std::ostream::flush();
          lVar13 = lVar13 + 1;
        } while (lVar13 < (int)((ulong)((long)operands.
                                              super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start -
                                       (long)local_50) >> 4));
      }
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bee8;
      poVar12 = Append(this);
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11beff;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"goto ",5);
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bf13;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Entry",5);
      operands.
      super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0x3b;
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bf27;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(char *)((long)&operands.
                                                  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4),1);
      uVar4 = *(undefined8 *)(*(long *)poVar12 + -0x18);
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bf3e;
      std::ios::widen((char)uVar4 + (char)poVar12);
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bf49;
      std::ostream::put((char)poVar12);
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bf51;
      std::ostream::flush();
      operands.
      super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = -1;
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bf67;
      std::deque<int,_std::allocator<int>_>::emplace_back<int>
                (&(this->stack).c,
                 (int *)((long)&operands.
                                super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      goto LAB_0011c047;
    }
  }
  *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bf74;
  AppendVariableDeclarationBegin(this);
  poVar12 = this->os;
  peVar2 = (op->super___shared_ptr<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bf8f;
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"user_defined_operator_",0x16);
  pcVar5 = (peVar2->definition).name._M_dataplus._M_p;
  sVar6 = (peVar2->definition).name._M_string_length;
  *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bf9f;
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar5,sVar6);
  operands.
  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0x28;
  *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bfb3;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,(char *)((long)&operands.
                                     super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),1);
  if ((undefined1  [8])
      operands.
      super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
      ._M_impl.super__Vector_impl_data._M_start != local_50) {
    uVar14 = 0;
    do {
      if (uVar14 != 0) {
        poVar12 = this->os;
        *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bfda;
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
      }
      poVar12 = this->os;
      iVar11 = *(int *)((long)aiStack_58 + uVar14 * 4 + lVar8 + 0x58);
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bff6;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"var_",4);
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11c001;
      std::ostream::operator<<(poVar12,iVar11);
      uVar14 = uVar14 + 1;
    } while (uVar14 < (ulong)((long)operands.
                                    super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start - (long)local_50 >> 4)
            );
  }
  poVar12 = this->os;
  operands.
  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0x29;
  *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11c02a;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,(char *)((long)&operands.
                                     super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),1);
  *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11c032;
  AppendVariableDeclarationEnd(this);
  operands.
  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = this->lastVariableNo;
  *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11c047;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>
            (&(this->stack).c,
             (int *)((long)&operands.
                            super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
LAB_0011c047:
  *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11c050;
  std::
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ::~vector((vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
             *)local_50);
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const UserDefinedOperator>& op) override
    {
        int* operandVariableNos =
            reinterpret_cast<int*>(alloca(sizeof(int) * op->GetDefinition().GetNumOperands()));

        auto operands = op->GetOperands();
        for (size_t i = 0; i < operands.size(); i++)
        {
            operandVariableNos[i] = ProcessOperator(operands[i]);
        }

        if (op->IsTailCall().value_or(false) && op->GetDefinition() == this->definition)
        {
            for (int i = 0; i < static_cast<int>(operands.size()); i++)
            {
                Append() << ArgumentName(i) << " = " << VariableName(operandVariableNos[i]) << ';'
                         << std::endl;
            }

            Append() << "goto " << OperatorEntryLabel() << ';' << std::endl;
            Return(-1);
        }
        else
        {
            AppendVariableDeclarationBegin();
            os << UserDefinedOperatorName(op->GetDefinition()) << '(';
            for (size_t i = 0; i < operands.size(); i++)
            {
                if (i > 0)
                {
                    os << ", ";
                }

                os << VariableName(operandVariableNos[i]);
            }
            os << ')';
            AppendVariableDeclarationEnd();
            Return();
        }
    }